

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64_out_32.h
# Opt level: O0

uint32_t __thiscall
PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
          (PMP_Multilinear_Hasher_64_out_32 *this,uchar *chars,uint cnt)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  uint64_t uVar13;
  uint in_EDX;
  long in_RSI;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long in_RDI;
  bool bVar20;
  uchar *tail;
  uint tailCnt;
  uint i;
  uint64_t tmp_hash;
  uint64_t allValues [8];
  uint32_t part;
  uint32_t hi_1;
  uint32_t lo_1;
  uint32_t diff;
  uint32_t hilo;
  uint32_t lohi;
  uint64_t hi;
  uint64_t lo;
  uint32_t *c3;
  uint32_t *c2;
  uint32_t *c1;
  uint32_t *x3;
  uint32_t *x2;
  uint32_t *x1;
  int i_1;
  __m128i temp;
  __m128i product;
  __m128i data;
  __m128i a;
  __m128i mask_low;
  __m128i ctr1;
  __m128i ctr0;
  uint64_t ctr;
  uint32_t part_1;
  uint32_t hi_2;
  uint32_t lo_2;
  uint32_t *x;
  uint32_t size;
  uint32_t xLast;
  uint64_t ctr_1;
  uint64_t dummy2_28;
  uint64_t dummy1_28;
  uint64_t dummy2_27;
  uint64_t dummy1_27;
  uint64_t dummy2_26;
  uint64_t dummy1_26;
  uint64_t dummy2_25;
  uint64_t dummy1_25;
  uint64_t dummy2_24;
  uint64_t dummy1_24;
  uint64_t dummy2_23;
  uint64_t dummy1_23;
  uint64_t dummy2_22;
  uint64_t dummy1_22;
  uint64_t dummy2_21;
  uint64_t dummy1_21;
  uint64_t dummy2_20;
  uint64_t dummy1_20;
  uint64_t dummy2_19;
  uint64_t dummy1_19;
  uint64_t dummy2_18;
  uint64_t dummy1_18;
  uint64_t dummy2_17;
  uint64_t dummy1_17;
  uint64_t dummy2_16;
  uint64_t dummy1_16;
  uint64_t dummy2_15;
  uint64_t dummy1_15;
  uint64_t dummy2_14;
  uint64_t dummy1_14;
  uint64_t dummy2_13;
  uint64_t dummy1_13;
  uint64_t dummy2_12;
  uint64_t dummy1_12;
  uint64_t dummy2_11;
  uint64_t dummy1_11;
  uint64_t dummy2_10;
  uint64_t dummy1_10;
  uint64_t dummy2_9;
  uint64_t dummy1_9;
  uint64_t dummy2_8;
  uint64_t dummy1_8;
  uint64_t dummy2_7;
  uint64_t dummy1_7;
  uint64_t dummy2_6;
  uint64_t dummy1_6;
  uint64_t dummy2_5;
  uint64_t dummy1_5;
  uint64_t dummy2_4;
  uint64_t dummy1_4;
  uint64_t dummy2_3;
  uint64_t dummy1_3;
  uint64_t dummy2_2;
  uint64_t dummy1_2;
  uint64_t dummy2_1;
  uint64_t dummy1_1;
  uint64_t dummy2;
  uint64_t dummy1;
  uint32_t part_2;
  uint32_t hi_3;
  uint32_t lo_3;
  uint64_t rhi;
  uint32_t i_2;
  ULARGE_INTEGER__XX c_ctr;
  uint64_t ctr_2;
  uint64_t dummy2_30;
  uint64_t dummy1_30;
  uint64_t dummy2_29;
  uint64_t dummy1_29;
  undefined4 in_stack_ffffffffffffe6c0;
  undefined4 in_stack_ffffffffffffe6c4;
  uint32_t *in_stack_ffffffffffffe6c8;
  undefined4 in_stack_ffffffffffffe6d0;
  undefined4 in_stack_ffffffffffffe6d4;
  ULARGE_INTEGER__XX in_stack_ffffffffffffe6d8;
  uint local_18e4;
  ulong local_18d8 [8];
  uint local_1894;
  long local_1890;
  uint local_187c;
  uint local_1878;
  undefined1 local_1874 [4];
  undefined1 local_1870 [4];
  uint local_186c;
  int local_1868;
  int local_1864;
  ulong local_1860;
  ulong local_1858;
  undefined1 (*local_1850) [16];
  undefined1 (*local_1848) [16];
  undefined1 (*local_1840) [16];
  undefined1 (*local_1838) [16];
  undefined1 (*local_1830) [16];
  undefined1 (*local_1828) [16];
  int local_181c;
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  long local_17a8;
  long local_17a0;
  long *local_1798;
  undefined8 local_1788;
  undefined4 local_1780;
  uint local_177c;
  undefined1 *local_1778;
  undefined1 *local_1770;
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined1 (*local_1728) [16];
  undefined1 (*local_1720) [16];
  undefined1 (*local_1718) [16];
  undefined1 (*local_1710) [16];
  undefined1 (*local_1708) [16];
  undefined1 (*local_1700) [16];
  undefined1 (*local_16f8) [16];
  undefined1 (*local_16f0) [16];
  undefined1 (*local_16e8) [16];
  undefined1 (*local_16e0) [16];
  undefined1 (*local_16d8) [16];
  undefined1 (*local_16d0) [16];
  undefined1 (*local_16c8) [16];
  undefined1 (*local_16c0) [16];
  undefined1 (*local_16b8) [16];
  undefined1 (*local_16b0) [16];
  undefined1 (*local_16a8) [16];
  undefined1 (*local_16a0) [16];
  undefined1 (*local_1698) [16];
  undefined1 (*local_1690) [16];
  undefined1 (*local_1688) [16];
  undefined1 (*local_1680) [16];
  undefined1 (*local_1678) [16];
  undefined1 (*local_1670) [16];
  undefined1 (*local_1668) [16];
  undefined1 (*local_1660) [16];
  undefined1 (*local_1658) [16];
  undefined1 (*local_1650) [16];
  undefined1 (*local_1648) [16];
  undefined1 (*local_1640) [16];
  undefined1 (*local_1638) [16];
  undefined1 (*local_1630) [16];
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined4 local_121c;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined4 local_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined4 local_11dc;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined4 local_11bc;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined4 local_119c;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined4 local_117c;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined4 local_115c;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined4 local_113c;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined4 local_111c;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined4 local_10fc;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined4 local_10dc;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined4 local_10bc;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined4 local_109c;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined4 local_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined4 local_105c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined4 local_103c;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined4 local_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined4 local_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined4 local_fdc;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined4 local_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined4 local_f9c;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined4 local_f7c;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined4 local_f5c;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined4 local_f3c;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined4 local_f1c;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined4 local_efc;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined4 local_edc;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined4 local_ebc;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined4 local_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined4 local_e7c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined4 local_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined4 local_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  uint local_5bc;
  undefined1 local_5b8 [4];
  undefined1 local_5b4 [4];
  uint *local_5b0;
  uint local_5a8;
  uint local_5a4;
  long local_5a0;
  uint local_594;
  uint *local_590;
  ulong *local_588;
  undefined8 local_578;
  undefined8 local_570;
  ulong local_568;
  uint local_560;
  uint local_55c;
  long *local_558;
  undefined8 *local_550;
  undefined8 local_548;
  ulong local_540;
  uint local_538;
  uint local_534;
  long *local_530;
  undefined8 *local_528;
  undefined8 local_520;
  ulong local_518;
  uint local_510;
  uint local_50c;
  long *local_508;
  undefined8 *local_500;
  undefined8 local_4f8;
  ulong local_4f0;
  uint local_4e8;
  uint local_4e4;
  long *local_4e0;
  undefined8 *local_4d8;
  undefined8 local_4d0;
  ulong local_4c8;
  uint local_4c0;
  uint local_4bc;
  long *local_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  ulong local_4a0;
  uint local_498;
  uint local_494;
  long *local_490;
  undefined8 *local_488;
  undefined8 local_480;
  ulong local_478;
  uint local_470;
  uint local_46c;
  long *local_468;
  undefined8 *local_460;
  undefined8 local_458;
  ulong local_450;
  uint local_448;
  uint local_444;
  long *local_440;
  undefined8 *local_438;
  undefined4 local_e8;
  uint local_e4;
  undefined1 *local_e0;
  undefined1 *local_d8;
  uint local_cc;
  undefined1 local_c8 [4];
  undefined1 local_c4 [4];
  undefined8 local_c0;
  uint local_b4;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  ulong *local_98;
  long local_90;
  long local_80;
  ulong local_78;
  undefined8 local_70;
  undefined8 local_68;
  ulong local_60;
  uint local_58;
  undefined4 local_54;
  long *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  ulong local_38;
  uint local_30;
  undefined4 local_2c;
  long *local_28;
  undefined8 *local_20;
  undefined4 local_18;
  uint local_14;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_1894 = in_EDX;
  local_1890 = in_RSI;
  for (local_18e4 = 0; local_18e4 < local_1894 >> 9; local_18e4 = local_18e4 + 1) {
    plVar1 = *(long **)(in_RDI + 8);
    local_1798 = plVar1 + 2;
    local_17a0 = local_1890 + (ulong)(local_18e4 << 7) * 4;
    local_1758 = (undefined1  [16])0x0;
    local_17b8 = ZEXT816(0);
    local_1768 = (undefined1  [16])0x0;
    local_17c8 = ZEXT816(0);
    local_172c = 0;
    local_1730 = 0xffffffff;
    local_1734 = 0;
    local_1738 = 0xffffffff;
    auVar3 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
    auVar3 = vpinsrd_avx(auVar3,0xffffffff,2);
    local_1748 = vpinsrd_avx(auVar3,0,3);
    local_17d8 = local_1748._0_8_;
    uStack_17d0 = local_1748._8_8_;
    local_181c = 0;
    while( true ) {
      if (0x7f < local_181c) break;
      local_16b0 = (undefined1 (*) [16])((long)local_1798 + (long)local_181c * 4);
      local_1248 = *(undefined8 *)*local_16b0;
      uStack_1240 = *(undefined8 *)(*local_16b0 + 8);
      local_1630 = (undefined1 (*) [16])(local_17a0 + (long)local_181c * 4);
      local_1238 = *(undefined8 *)*local_1630;
      uStack_1230 = *(undefined8 *)(*local_1630 + 8);
      auVar4 = vpmuludq_avx(*local_1630,*local_16b0);
      local_1808._0_8_ = auVar4._0_8_;
      local_e38 = local_1808._0_8_;
      local_1808._8_8_ = auVar4._8_8_;
      uStack_e30 = local_1808._8_8_;
      local_e3c = 0x20;
      auVar3 = vpsrlq_avx(auVar4,ZEXT416(0x20));
      local_618 = local_17c8._0_8_;
      uStack_610 = local_17c8._8_8_;
      local_1818._0_8_ = auVar3._0_8_;
      local_628 = local_1818._0_8_;
      local_1818._8_8_ = auVar3._8_8_;
      uStack_620 = local_1818._8_8_;
      auVar3 = vpaddq_avx(local_17c8,auVar3);
      local_638 = local_17b8._0_8_;
      uStack_630 = local_17b8._8_8_;
      local_648 = local_1808._0_8_;
      uStack_640 = local_1808._8_8_;
      auVar4 = vpaddq_avx(local_17b8,auVar4);
      auVar5 = vpshufd_avx(*local_16b0,0xb1);
      auVar6 = vpshufd_avx(*local_1630,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1258 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1250 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_1268 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_1260 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_e58 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_e50 = local_1808._8_8_;
      local_e5c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_658 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_650 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_668 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_660 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_678 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_670 = local_17b8._8_8_;
      local_688 = local_1808._0_8_;
      uStack_680 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_16b8 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x20);
      local_1288 = *(undefined8 *)*local_16b8;
      uStack_1280 = *(undefined8 *)(*local_16b8 + 8);
      local_1638 = (undefined1 (*) [16])(local_17a0 + 0x10 + (long)local_181c * 4);
      local_1278 = *(undefined8 *)*local_1638;
      uStack_1270 = *(undefined8 *)(*local_1638 + 8);
      auVar5 = vpmuludq_avx(*local_1638,*local_16b8);
      local_1808._0_8_ = auVar5._0_8_;
      local_e78 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_e70 = local_1808._8_8_;
      local_e7c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_698 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_690 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_6a8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_6a0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_6b8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_6b0 = local_17b8._8_8_;
      local_6c8 = local_1808._0_8_;
      uStack_6c0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16b8,0xb1);
      auVar6 = vpshufd_avx(*local_1638,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1298 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1290 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_12a8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_12a0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_e98 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_e90 = local_1808._8_8_;
      local_e9c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_6d8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_6d0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_6e8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_6e0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_6f8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_6f0 = local_17b8._8_8_;
      local_708 = local_1808._0_8_;
      uStack_700 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_16c0 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x30);
      local_12c8 = *(undefined8 *)*local_16c0;
      uStack_12c0 = *(undefined8 *)(*local_16c0 + 8);
      local_1640 = (undefined1 (*) [16])(local_17a0 + 0x20 + (long)local_181c * 4);
      local_12b8 = *(undefined8 *)*local_1640;
      uStack_12b0 = *(undefined8 *)(*local_1640 + 8);
      auVar5 = vpmuludq_avx(*local_1640,*local_16c0);
      local_1808._0_8_ = auVar5._0_8_;
      local_eb8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_eb0 = local_1808._8_8_;
      local_ebc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_718 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_710 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_728 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_720 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_738 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_730 = local_17b8._8_8_;
      local_748 = local_1808._0_8_;
      uStack_740 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16c0,0xb1);
      auVar6 = vpshufd_avx(*local_1640,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_12d8 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_12d0 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_12e8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_12e0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_ed8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_ed0 = local_1808._8_8_;
      local_edc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_758 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_750 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_768 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_760 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_778 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_770 = local_17b8._8_8_;
      local_788 = local_1808._0_8_;
      uStack_780 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_16c8 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x40);
      local_1308 = *(undefined8 *)*local_16c8;
      uStack_1300 = *(undefined8 *)(*local_16c8 + 8);
      local_1648 = (undefined1 (*) [16])(local_17a0 + 0x30 + (long)local_181c * 4);
      local_12f8 = *(undefined8 *)*local_1648;
      uStack_12f0 = *(undefined8 *)(*local_1648 + 8);
      auVar5 = vpmuludq_avx(*local_1648,*local_16c8);
      local_1808._0_8_ = auVar5._0_8_;
      local_ef8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_ef0 = local_1808._8_8_;
      local_efc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_798 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_790 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_7a8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_7a0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_7b8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_7b0 = local_17b8._8_8_;
      local_7c8 = local_1808._0_8_;
      uStack_7c0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16c8,0xb1);
      auVar6 = vpshufd_avx(*local_1648,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1318 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1310 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_1328 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_1320 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_f18 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_f10 = local_1808._8_8_;
      local_f1c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_7d8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_7d0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_7e8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_7e0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_7f8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_7f0 = local_17b8._8_8_;
      local_808 = local_1808._0_8_;
      uStack_800 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_16d0 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x50);
      local_1348 = *(undefined8 *)*local_16d0;
      uStack_1340 = *(undefined8 *)(*local_16d0 + 8);
      local_1650 = (undefined1 (*) [16])(local_17a0 + 0x40 + (long)local_181c * 4);
      local_1338 = *(undefined8 *)*local_1650;
      uStack_1330 = *(undefined8 *)(*local_1650 + 8);
      auVar5 = vpmuludq_avx(*local_1650,*local_16d0);
      local_1808._0_8_ = auVar5._0_8_;
      local_f38 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_f30 = local_1808._8_8_;
      local_f3c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_818 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_810 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_828 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_820 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_838 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_830 = local_17b8._8_8_;
      local_848 = local_1808._0_8_;
      uStack_840 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16d0,0xb1);
      auVar6 = vpshufd_avx(*local_1650,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1358 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1350 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_1368 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_1360 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_f58 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_f50 = local_1808._8_8_;
      local_f5c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_858 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_850 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_868 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_860 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_878 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_870 = local_17b8._8_8_;
      local_888 = local_1808._0_8_;
      uStack_880 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_16d8 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x60);
      local_1388 = *(undefined8 *)*local_16d8;
      uStack_1380 = *(undefined8 *)(*local_16d8 + 8);
      local_1658 = (undefined1 (*) [16])(local_17a0 + 0x50 + (long)local_181c * 4);
      local_1378 = *(undefined8 *)*local_1658;
      uStack_1370 = *(undefined8 *)(*local_1658 + 8);
      auVar5 = vpmuludq_avx(*local_1658,*local_16d8);
      local_1808._0_8_ = auVar5._0_8_;
      local_f78 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_f70 = local_1808._8_8_;
      local_f7c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_898 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_890 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_8a8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_8a0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_8b8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_8b0 = local_17b8._8_8_;
      local_8c8 = local_1808._0_8_;
      uStack_8c0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16d8,0xb1);
      auVar6 = vpshufd_avx(*local_1658,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1398 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1390 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_13a8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_13a0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_f98 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_f90 = local_1808._8_8_;
      local_f9c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_8d8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_8d0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_8e8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_8e0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_8f8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_8f0 = local_17b8._8_8_;
      local_908 = local_1808._0_8_;
      uStack_900 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_16e0 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x70);
      local_13c8 = *(undefined8 *)*local_16e0;
      uStack_13c0 = *(undefined8 *)(*local_16e0 + 8);
      local_1660 = (undefined1 (*) [16])(local_17a0 + 0x60 + (long)local_181c * 4);
      local_13b8 = *(undefined8 *)*local_1660;
      uStack_13b0 = *(undefined8 *)(*local_1660 + 8);
      auVar5 = vpmuludq_avx(*local_1660,*local_16e0);
      local_1808._0_8_ = auVar5._0_8_;
      local_fb8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_fb0 = local_1808._8_8_;
      local_fbc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_918 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_910 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_928 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_920 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_938 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_930 = local_17b8._8_8_;
      local_948 = local_1808._0_8_;
      uStack_940 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16e0,0xb1);
      auVar6 = vpshufd_avx(*local_1660,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_13d8 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_13d0 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_13e8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_13e0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_fd8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_fd0 = local_1808._8_8_;
      local_fdc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_958 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_950 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_968 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_960 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_978 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_970 = local_17b8._8_8_;
      local_988 = local_1808._0_8_;
      uStack_980 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_16e8 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x80);
      local_1408 = *(undefined8 *)*local_16e8;
      uStack_1400 = *(undefined8 *)(*local_16e8 + 8);
      local_1668 = (undefined1 (*) [16])(local_17a0 + 0x70 + (long)local_181c * 4);
      local_13f8 = *(undefined8 *)*local_1668;
      uStack_13f0 = *(undefined8 *)(*local_1668 + 8);
      auVar5 = vpmuludq_avx(*local_1668,*local_16e8);
      local_1808._0_8_ = auVar5._0_8_;
      local_ff8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_ff0 = local_1808._8_8_;
      local_ffc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_998 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_990 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_9a8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_9a0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_9b8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_9b0 = local_17b8._8_8_;
      local_9c8 = local_1808._0_8_;
      uStack_9c0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16e8,0xb1);
      auVar6 = vpshufd_avx(*local_1668,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1418 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1410 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_1428 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_1420 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_1018 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1010 = local_1808._8_8_;
      local_101c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_9d8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_9d0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_9e8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_9e0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_9f8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_9f0 = local_17b8._8_8_;
      local_a08 = local_1808._0_8_;
      uStack_a00 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_1678 = (undefined1 (*) [16])(local_17a0 + 0x90 + (long)local_181c * 4);
      local_1680 = (undefined1 (*) [16])(local_17a0 + 0xa0 + (long)local_181c * 4);
      local_1688 = (undefined1 (*) [16])(local_17a0 + 0xb0 + (long)local_181c * 4);
      local_16f8 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0xa0);
      local_1700 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0xb0);
      local_1708 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0xc0);
      local_16f0 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x90);
      local_1448 = *(undefined8 *)*local_16f0;
      uStack_1440 = *(undefined8 *)(*local_16f0 + 8);
      local_1670 = (undefined1 (*) [16])(local_17a0 + 0x80 + (long)local_181c * 4);
      local_1438 = *(undefined8 *)*local_1670;
      uStack_1430 = *(undefined8 *)(*local_1670 + 8);
      auVar5 = vpmuludq_avx(*local_1670,*local_16f0);
      local_1808._0_8_ = auVar5._0_8_;
      local_1038 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1030 = local_1808._8_8_;
      local_103c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_a18 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_a10 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_a28 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_a20 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_a38 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_a30 = local_17b8._8_8_;
      local_a48 = local_1808._0_8_;
      uStack_a40 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16f0,0xb1);
      auVar6 = vpshufd_avx(*local_1670,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1458 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1450 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_1468 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_1460 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_1058 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1050 = local_1808._8_8_;
      local_105c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_a58 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_a50 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_a68 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_a60 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_a78 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_a70 = local_17b8._8_8_;
      local_a88 = local_1808._0_8_;
      uStack_a80 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_1488 = *(undefined8 *)*local_16f8;
      uStack_1480 = *(undefined8 *)(*local_16f8 + 8);
      local_1478 = *(undefined8 *)*local_1678;
      uStack_1470 = *(undefined8 *)(*local_1678 + 8);
      auVar5 = vpmuludq_avx(*local_1678,*local_16f8);
      local_1808._0_8_ = auVar5._0_8_;
      local_1078 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1070 = local_1808._8_8_;
      local_107c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_a98 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_a90 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_aa8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_aa0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_ab8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_ab0 = local_17b8._8_8_;
      local_ac8 = local_1808._0_8_;
      uStack_ac0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_16f8,0xb1);
      auVar6 = vpshufd_avx(*local_1678,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1498 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1490 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_14a8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_14a0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_1098 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1090 = local_1808._8_8_;
      local_109c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_ad8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_ad0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_ae8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_ae0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_af8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_af0 = local_17b8._8_8_;
      local_b08 = local_1808._0_8_;
      uStack_b00 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_14c8 = *(undefined8 *)*local_1700;
      uStack_14c0 = *(undefined8 *)(*local_1700 + 8);
      local_14b8 = *(undefined8 *)*local_1680;
      uStack_14b0 = *(undefined8 *)(*local_1680 + 8);
      auVar5 = vpmuludq_avx(*local_1680,*local_1700);
      local_1808._0_8_ = auVar5._0_8_;
      local_10b8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_10b0 = local_1808._8_8_;
      local_10bc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_b18 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_b10 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_b28 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_b20 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_b38 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_b30 = local_17b8._8_8_;
      local_b48 = local_1808._0_8_;
      uStack_b40 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_1700,0xb1);
      auVar6 = vpshufd_avx(*local_1680,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_14d8 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_14d0 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_14e8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_14e0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_10d8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_10d0 = local_1808._8_8_;
      local_10dc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_b58 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_b50 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_b68 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_b60 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_b78 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_b70 = local_17b8._8_8_;
      local_b88 = local_1808._0_8_;
      uStack_b80 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_1508 = *(undefined8 *)*local_1708;
      uStack_1500 = *(undefined8 *)(*local_1708 + 8);
      local_14f8 = *(undefined8 *)*local_1688;
      uStack_14f0 = *(undefined8 *)(*local_1688 + 8);
      auVar5 = vpmuludq_avx(*local_1688,*local_1708);
      local_1808._0_8_ = auVar5._0_8_;
      local_10f8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_10f0 = local_1808._8_8_;
      local_10fc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_b98 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_b90 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_ba8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_ba0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_bb8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_bb0 = local_17b8._8_8_;
      local_bc8 = local_1808._0_8_;
      uStack_bc0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_1708,0xb1);
      auVar6 = vpshufd_avx(*local_1688,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1518 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1510 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_1528 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_1520 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_1118 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1110 = local_1808._8_8_;
      local_111c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_bd8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_bd0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_be8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_be0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_bf8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_bf0 = local_17b8._8_8_;
      local_c08 = local_1808._0_8_;
      uStack_c00 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_1828 = (undefined1 (*) [16])(local_17a0 + 0xd0 + (long)local_181c * 4);
      local_1830 = (undefined1 (*) [16])(local_17a0 + 0xe0 + (long)local_181c * 4);
      local_1838 = (undefined1 (*) [16])(local_17a0 + 0xf0 + (long)local_181c * 4);
      local_1840 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0xe0);
      local_1848 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0xf0);
      local_1850 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0x100);
      local_1710 = (undefined1 (*) [16])((long)plVar1 + (long)local_181c * 4 + 0xd0);
      local_1548 = *(undefined8 *)*local_1710;
      uStack_1540 = *(undefined8 *)(*local_1710 + 8);
      local_1690 = (undefined1 (*) [16])(local_17a0 + 0xc0 + (long)local_181c * 4);
      local_1538 = *(undefined8 *)*local_1690;
      uStack_1530 = *(undefined8 *)(*local_1690 + 8);
      auVar5 = vpmuludq_avx(*local_1690,*local_1710);
      local_1808._0_8_ = auVar5._0_8_;
      local_1138 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1130 = local_1808._8_8_;
      local_113c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_c18 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_c10 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_c28 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_c20 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_c38 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_c30 = local_17b8._8_8_;
      local_c48 = local_1808._0_8_;
      uStack_c40 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_1710,0xb1);
      auVar6 = vpshufd_avx(*local_1690,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1558 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1550 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_1568 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_1560 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_1158 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1150 = local_1808._8_8_;
      local_115c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_c58 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_c50 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_c68 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_c60 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_c78 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_c70 = local_17b8._8_8_;
      local_c88 = local_1808._0_8_;
      uStack_c80 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_1588 = *(undefined8 *)*local_1840;
      uStack_1580 = *(undefined8 *)(*local_1840 + 8);
      local_1578 = *(undefined8 *)*local_1828;
      uStack_1570 = *(undefined8 *)(*local_1828 + 8);
      auVar5 = vpmuludq_avx(*local_1828,*local_1840);
      local_1808._0_8_ = auVar5._0_8_;
      local_1178 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1170 = local_1808._8_8_;
      local_117c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_c98 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_c90 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_ca8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_ca0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_cb8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_cb0 = local_17b8._8_8_;
      local_cc8 = local_1808._0_8_;
      uStack_cc0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_1840,0xb1);
      auVar6 = vpshufd_avx(*local_1828,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_1598 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_1590 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_15a8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_15a0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_1198 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_1190 = local_1808._8_8_;
      local_119c = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_cd8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_cd0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_ce8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_ce0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_cf8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_cf0 = local_17b8._8_8_;
      local_d08 = local_1808._0_8_;
      uStack_d00 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_15c8 = *(undefined8 *)*local_1848;
      uStack_15c0 = *(undefined8 *)(*local_1848 + 8);
      local_15b8 = *(undefined8 *)*local_1830;
      uStack_15b0 = *(undefined8 *)(*local_1830 + 8);
      auVar5 = vpmuludq_avx(*local_1830,*local_1848);
      local_1808._0_8_ = auVar5._0_8_;
      local_11b8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_11b0 = local_1808._8_8_;
      local_11bc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_d18 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_d10 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_d28 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_d20 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_d38 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_d30 = local_17b8._8_8_;
      local_d48 = local_1808._0_8_;
      uStack_d40 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(*local_1848,0xb1);
      auVar6 = vpshufd_avx(*local_1830,0xb1);
      local_17f8._0_8_ = auVar6._0_8_;
      local_15d8 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar6._8_8_;
      uStack_15d0 = local_17f8._8_8_;
      local_17e8._0_8_ = auVar5._0_8_;
      local_15e8 = local_17e8._0_8_;
      local_17e8._8_8_ = auVar5._8_8_;
      uStack_15e0 = local_17e8._8_8_;
      auVar5 = vpmuludq_avx(auVar6,auVar5);
      local_1808._0_8_ = auVar5._0_8_;
      local_11d8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_11d0 = local_1808._8_8_;
      local_11dc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_d58 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_d50 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_d68 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_d60 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_d78 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_d70 = local_17b8._8_8_;
      local_d88 = local_1808._0_8_;
      uStack_d80 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_1608 = *(undefined8 *)*local_1850;
      uStack_1600 = *(undefined8 *)(*local_1850 + 8);
      local_15f8 = *(undefined8 *)*local_1838;
      uStack_15f0 = *(undefined8 *)(*local_1838 + 8);
      auVar5 = vpmuludq_avx(*local_1838,*local_1850);
      local_1808._0_8_ = auVar5._0_8_;
      local_11f8 = local_1808._0_8_;
      local_1808._8_8_ = auVar5._8_8_;
      uStack_11f0 = local_1808._8_8_;
      local_11fc = 0x20;
      auVar6 = vpsrlq_avx(auVar5,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_d98 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_d90 = local_17c8._8_8_;
      local_1818._0_8_ = auVar6._0_8_;
      local_da8 = local_1818._0_8_;
      local_1818._8_8_ = auVar6._8_8_;
      uStack_da0 = local_1818._8_8_;
      auVar3 = vpaddq_avx(auVar3,auVar6);
      local_17b8._0_8_ = auVar4._0_8_;
      local_db8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_db0 = local_17b8._8_8_;
      local_dc8 = local_1808._0_8_;
      uStack_dc0 = local_1808._8_8_;
      auVar4 = vpaddq_avx(auVar4,auVar5);
      local_17e8 = vpshufd_avx(*local_1850,0xb1);
      auVar5 = vpshufd_avx(*local_1838,0xb1);
      local_17f8._0_8_ = auVar5._0_8_;
      local_1618 = local_17f8._0_8_;
      local_17f8._8_8_ = auVar5._8_8_;
      uStack_1610 = local_17f8._8_8_;
      local_1628 = local_17e8._0_8_;
      uStack_1620 = local_17e8._8_8_;
      auVar5 = vpblendd_avx2(auVar5,(undefined1  [16])0x0,10);
      auVar6 = vpblendd_avx2(local_17e8,(undefined1  [16])0x0,10);
      local_1808 = vpmullq_avx512vl(auVar5,auVar6);
      local_1218 = local_1808._0_8_;
      uStack_1210 = local_1808._8_8_;
      local_121c = 0x20;
      auVar5 = vpsrlq_avx(local_1808,ZEXT416(0x20));
      local_17c8._0_8_ = auVar3._0_8_;
      local_dd8 = local_17c8._0_8_;
      local_17c8._8_8_ = auVar3._8_8_;
      uStack_dd0 = local_17c8._8_8_;
      local_1818._0_8_ = auVar5._0_8_;
      local_de8 = local_1818._0_8_;
      local_1818._8_8_ = auVar5._8_8_;
      uStack_de0 = local_1818._8_8_;
      local_17c8 = vpaddq_avx(auVar3,auVar5);
      local_17b8._0_8_ = auVar4._0_8_;
      local_df8 = local_17b8._0_8_;
      local_17b8._8_8_ = auVar4._8_8_;
      uStack_df0 = local_17b8._8_8_;
      local_e08 = local_1808._0_8_;
      uStack_e00 = local_1808._8_8_;
      local_17b8 = vpaddq_avx(auVar4,local_1808);
      local_181c = local_181c + 0x40;
      local_1728 = local_1850;
      local_1720 = local_1848;
      local_1718 = local_1840;
      local_16a8 = local_1838;
      local_16a0 = local_1830;
      local_1698 = local_1828;
    }
    local_5f8 = local_17b8._0_8_;
    uStack_5f0 = local_17b8._8_8_;
    local_608 = local_17c8._0_8_;
    uStack_600 = local_17c8._8_8_;
    local_1818 = vpunpckhqdq_avx(local_17b8,local_17c8);
    local_5d8 = local_17b8._0_8_;
    uStack_5d0 = local_17b8._8_8_;
    local_5e8 = local_17c8._0_8_;
    uStack_5e0 = local_17c8._8_8_;
    local_17f8 = vpunpcklqdq_avx(local_17b8,local_17c8);
    local_e18 = local_17f8._0_8_;
    uStack_e10 = local_17f8._8_8_;
    local_e28 = local_1818._0_8_;
    uStack_e20 = local_1818._8_8_;
    local_17c8 = vpaddq_avx(local_17f8,local_1818);
    local_1864 = local_17c8._4_4_;
    local_1868 = local_17c8._8_4_;
    local_186c = local_1864 - local_1868;
    local_1860 = (ulong)local_186c + local_17c8._8_8_;
    local_1858 = (local_17c8._0_8_ & 0xffffffff) + (local_1860 << 0x20);
    uVar11 = local_1858 + *plVar1;
    local_17a8 = (local_1860 >> 0x20) + (ulong)(uVar11 < local_1858);
    local_1788._4_4_ = (uint)(uVar11 >> 0x20);
    local_1770 = local_1874;
    local_1778 = local_1870;
    local_177c = local_1788._4_4_;
    local_1780 = 0xf;
    in_stack_ffffffffffffe6c4 = 0xf;
    uVar9 = (uint)((ulong)local_1788._4_4_ * 0xf);
    local_1878 = (int)local_17a8 * 0xe1 + (int)((ulong)local_1788._4_4_ * 0xf >> 0x20) * 0xf + 0xf;
    local_1788._0_4_ = (int)uVar11;
    uVar7 = local_1878 + (int)local_1788;
    iVar8 = ((uVar7 < local_1878) + 1) - (uint)(uVar7 < uVar9);
    uVar7 = uVar7 - uVar9;
    local_1788 = CONCAT44(iVar8,uVar7);
    if (uVar7 < 0x1e) {
      if (iVar8 != 0) {
        local_1788 = (ulong)((uVar7 + iVar8 * -0xf) - 0xf);
      }
    }
    else {
      local_1788 = (ulong)(uVar7 + iVar8 * -0xf);
    }
    local_18d8[local_18e4] = local_1788;
  }
  uVar9 = local_1894 & 0x1ff;
  puVar12 = (uint *)(local_1890 + (ulong)(local_1894 & 0xfffffe00));
  if (uVar9 < 4) {
    puVar2 = *(ulong **)(in_RDI + 8);
    local_588 = puVar2 + 2;
    local_578 = *puVar2;
    local_5a0 = 0;
    local_5a8 = uVar9 >> 2;
    if (6 < local_5a8) {
      local_444 = *puVar12;
      local_448 = (uint)*local_588;
      local_438 = &local_578;
      local_440 = &local_5a0;
      local_450 = (ulong)local_444 * (ulong)local_448;
      local_458 = SUB168(SEXT816((long)(ulong)local_444) * SEXT816((long)(ulong)local_448),8);
      bVar20 = CARRY8(local_578,local_450);
      uVar11 = local_578 + local_450;
      local_46c = puVar12[1];
      local_470 = *(uint *)((long)puVar2 + 0x14);
      local_460 = &local_578;
      local_468 = &local_5a0;
      local_478 = (ulong)local_46c * (ulong)local_470;
      local_480 = SUB168(SEXT816((long)(ulong)local_46c) * SEXT816((long)(ulong)local_470),8);
      uVar14 = uVar11 + local_478;
      local_494 = puVar12[2];
      local_498 = (uint)puVar2[3];
      local_488 = &local_578;
      local_490 = &local_5a0;
      local_4a0 = (ulong)local_494 * (ulong)local_498;
      local_4a8 = SUB168(SEXT816((long)(ulong)local_494) * SEXT816((long)(ulong)local_498),8);
      uVar15 = uVar14 + local_4a0;
      local_4bc = puVar12[3];
      local_4c0 = *(uint *)((long)puVar2 + 0x1c);
      local_4b0 = &local_578;
      local_4b8 = &local_5a0;
      local_4c8 = (ulong)local_4bc * (ulong)local_4c0;
      local_4d0 = SUB168(SEXT816((long)(ulong)local_4bc) * SEXT816((long)(ulong)local_4c0),8);
      uVar16 = uVar15 + local_4c8;
      local_4e4 = puVar12[4];
      local_4e8 = (uint)puVar2[4];
      local_4d8 = &local_578;
      local_4e0 = &local_5a0;
      local_4f0 = (ulong)local_4e4 * (ulong)local_4e8;
      local_4f8 = SUB168(SEXT816((long)(ulong)local_4e4) * SEXT816((long)(ulong)local_4e8),8);
      uVar17 = uVar16 + local_4f0;
      local_50c = puVar12[5];
      local_510 = *(uint *)((long)puVar2 + 0x24);
      local_500 = &local_578;
      local_508 = &local_5a0;
      local_518 = (ulong)local_50c * (ulong)local_510;
      local_520 = SUB168(SEXT816((long)(ulong)local_50c) * SEXT816((long)(ulong)local_510),8);
      uVar18 = uVar17 + local_518;
      local_534 = puVar12[6];
      local_538 = (uint)puVar2[5];
      local_528 = &local_578;
      local_530 = &local_5a0;
      local_540 = (ulong)local_534 * (ulong)local_538;
      local_548 = SUB168(SEXT816((long)(ulong)local_534) * SEXT816((long)(ulong)local_538),8);
      local_578 = uVar18 + local_540;
      local_5a0 = (ulong)bVar20 + (ulong)CARRY8(uVar11,local_478) + (ulong)CARRY8(uVar14,local_4a0)
                  + (ulong)CARRY8(uVar15,local_4c8) + (ulong)CARRY8(uVar16,local_4f0) +
                  (ulong)CARRY8(uVar17,local_518) + (ulong)CARRY8(uVar18,local_540);
    }
    switch(local_1894 & 3) {
    case 0:
      local_5a4 = 1;
      break;
    case 1:
      local_5a4 = *(byte *)((long)puVar12 + (ulong)(uVar9 - 1)) | 0x100;
      break;
    case 2:
      local_5a4 = *(ushort *)((long)puVar12 + ((ulong)uVar9 - 2)) | 0x10000;
      break;
    case 3:
      local_5a4 = CONCAT12(*(undefined1 *)((long)puVar12 + (ulong)(uVar9 - 1)),
                           *(undefined2 *)((long)puVar12 + ((ulong)uVar9 - 3))) | 0x1000000;
    }
    local_560 = *(uint *)((long)local_588 + (ulong)local_5a8 * 4);
    local_550 = &local_578;
    local_558 = &local_5a0;
    local_55c = local_5a4;
    local_568 = (ulong)local_5a4 * (ulong)local_560;
    local_570 = SUB168(SEXT816((long)(ulong)local_5a4) * SEXT816((long)(ulong)local_560),8);
    lVar19 = local_578 + local_568;
    local_5a0 = local_5a0 + (ulong)CARRY8(local_578,local_568);
    local_578._4_4_ = (uint)((ulong)lVar19 >> 0x20);
    local_d8 = local_5b8;
    local_e0 = local_5b4;
    local_e4 = local_578._4_4_;
    local_e8 = 0xf;
    uVar7 = (uint)((ulong)local_578._4_4_ * 0xf);
    local_5bc = (int)local_5a0 * 0xe1 + (int)((ulong)local_578._4_4_ * 0xf >> 0x20) * 0xf + 0xf;
    local_578._0_4_ = (int)lVar19;
    uVar10 = local_5bc + (int)local_578;
    iVar8 = ((uVar10 < local_5bc) + 1) - (uint)(uVar10 < uVar7);
    uVar10 = uVar10 - uVar7;
    local_578 = CONCAT44(iVar8,uVar10);
    if (uVar10 < 0x1e) {
      if (iVar8 != 0) {
        local_578 = (ulong)((uVar10 + iVar8 * -0xf) - 0xf);
      }
    }
    else {
      local_578 = (ulong)(uVar10 + iVar8 * -0xf);
    }
    local_18d8[local_18e4] = local_578;
    local_5b0 = puVar12;
    local_594 = uVar9;
    local_590 = puVar12;
  }
  else {
    uVar13 = hash_of_beginning_of_string_chunk_type2_noinline
                       ((PMP_Multilinear_Hasher_64_out_32 *)
                        CONCAT44(in_stack_ffffffffffffe6d4,in_stack_ffffffffffffe6d0),
                        in_stack_ffffffffffffe6c8,in_stack_ffffffffffffe6d8,
                        (uchar *)CONCAT44(in_stack_ffffffffffffe6c4,in_stack_ffffffffffffe6c0),
                        (uint)((ulong)in_RDI >> 0x20));
    local_18d8[local_18e4] = uVar13;
  }
  local_90 = *(long *)(in_RDI + 8) + 0x220;
  local_70 = *(ulong *)(*(long *)(in_RDI + 8) + 0x210);
  local_78 = **(ulong **)(in_RDI + 8);
  local_80 = *(long *)(*(long *)(in_RDI + 8) + 0x218);
  local_98 = local_18d8;
  local_a0 = (ulong)(local_18e4 + 1);
  local_a8 = 0;
  local_b0 = 0;
  if (local_a0 < 0x40) {
    for (local_b4 = 0; local_b4 < local_a0; local_b4 = local_b4 + 1) {
      local_30 = *(uint *)(local_90 + (ulong)local_b4 * 4);
      local_20 = &local_70;
      local_28 = &local_a8;
      local_2c = (undefined4)local_98[local_b4];
      uVar11 = local_98[local_b4] & 0xffffffff;
      local_38 = uVar11 * local_30;
      local_40 = SUB168(SEXT816((long)uVar11) * SEXT816((long)(ulong)local_30),8);
      bVar20 = CARRY8(local_70,local_38);
      local_70 = local_70 + local_38;
      local_a8 = local_a8 + (ulong)bVar20;
      local_b0 = *(uint *)(local_90 + (ulong)local_b4 * 4) + local_b0;
    }
    local_b0 = local_80 - local_b0;
  }
  else {
    for (local_b4 = 0; local_b4 < local_a0; local_b4 = local_b4 + 1) {
      local_58 = *(uint *)(local_90 + (ulong)local_b4 * 4);
      local_48 = &local_70;
      local_50 = &local_a8;
      local_54 = (undefined4)local_98[local_b4];
      uVar11 = local_98[local_b4] & 0xffffffff;
      local_60 = uVar11 * local_58;
      local_68 = SUB168(SEXT816((long)uVar11) * SEXT816((long)(ulong)local_58),8);
      bVar20 = CARRY8(local_70,local_60);
      local_70 = local_70 + local_60;
      local_a8 = local_a8 + (ulong)bVar20;
    }
    for (; local_b4 < 0x80; local_b4 = local_b4 + 1) {
      local_b0 = *(uint *)(local_90 + (ulong)local_b4 * 4) + local_b0;
    }
  }
  auVar5._8_8_ = local_a8;
  auVar5._0_8_ = local_70;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_b0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_78;
  local_c0 = SUB168(auVar3 * auVar4,0);
  auVar5 = auVar3 * auVar4 + auVar5;
  local_a8 = auVar5._8_8_;
  local_70._4_4_ = auVar5._4_4_;
  local_8 = local_c8;
  local_10 = local_c4;
  local_14 = local_70._4_4_;
  local_18 = 0xf;
  uVar9 = (uint)((ulong)local_70._4_4_ * 0xf);
  local_cc = auVar5._8_4_ * 0xe1 + (int)((ulong)local_70._4_4_ * 0xf >> 0x20) * 0xf + 0xf;
  local_70._0_4_ = auVar5._0_4_;
  uVar7 = local_cc + (int)local_70;
  iVar8 = ((uVar7 < local_cc) + 1) - (uint)(uVar7 < uVar9);
  uVar7 = uVar7 - uVar9;
  local_70 = CONCAT44(iVar8,uVar7);
  if (uVar7 < 0x1e) {
    if (iVar8 != 0) {
      local_70 = (ulong)((uVar7 + iVar8 * -0xf) - 0xf);
    }
  }
  else {
    local_70 = (ulong)(uVar7 + iVar8 * -0xf);
  }
  local_187c = (uint)local_70;
  if (local_70 >> 0x20 == 0) {
    local_187c = fmix32_short(local_187c);
  }
  return local_187c;
}

Assistant:

NOINLINE uint32_t _hash_noRecursionNoInline_forLessThan8Chunks(const unsigned char* chars, unsigned int cnt) const
  {
			uint64_t allValues[ 8 ];
			uint64_t tmp_hash;
			unsigned int i;
			// process full chunks
			for ( i=0; i<(cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2); i++ )
			{
				allValues[ i ] = hash_of_string_chunk_compact( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), ((const uint32_t*)(chars)) + ( i << PMPML_CHUNK_SIZE_LOG2 ) );
			}
			// process remaining incomplete chunk(s)
			// note: if string size is a multiple of chunk size, we create a new chunk (1,0,0,...0),
			// so THIS PROCESSING IS ALWAYS PERFORMED
			unsigned int tailCnt = cnt & ( PMPML_CHUNK_SIZE_BYTES - 1 );
			const unsigned char* tail = chars + ( (cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2) << PMPML_CHUNK_SIZE_BYTES_LOG2 );
			if ( tailCnt < 4 )
				allValues[ i ] = hash_of_beginning_of_string_chunk_size03( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
			else
				allValues[ i ] = hash_of_beginning_of_string_chunk_type2_noinline( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
//			allValues[ i ] = hash_of_beginning_of_string_chunk_type2( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );

			tmp_hash = hash_of_num_chunk_incomplete( curr_rd[ 1 ].random_coeff,
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].cachedSum)),
							allValues,
							i+1);

			if ( ( tmp_hash >> 32 ) == 0 ) //LIKELY
			{
				return fmix32_short( (uint32_t)tmp_hash );
			}
			return (uint32_t)tmp_hash;
  }